

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::processFunctions(TranslateToFuzzReader *this)

{
  Random *this_00;
  pointer puVar1;
  pointer puVar2;
  _Head_base<0UL,_wasm::Function_*,_false> _Var3;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> uVar4;
  bool bVar5;
  char *pcVar6;
  pointer ppFVar7;
  uint32_t uVar8;
  long lVar9;
  undefined8 *puVar10;
  long lVar11;
  value_type *pvVar12;
  Call *left;
  Block *pBVar13;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args;
  long extraout_RDX;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar14;
  ulong uVar15;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_3;
  pointer ppFVar16;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_2;
  ulong uVar17;
  Name NVar18;
  optional<wasm::Type> type;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_98;
  Random *local_80;
  uint32_t local_74;
  Builder *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> noParamsOrResultFuncs;
  pointer ppFStack_48;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> moddable;
  
  ppFStack_48 = (pointer)0x0;
  moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar14 = (this->wasm->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar14 != puVar1) {
    do {
      if (*(char **)((long)&((puVar14->_M_t).
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->
                            super_Importable + 0x20) == (char *)0x0) {
        auStack_68 = (undefined1  [8])
                     (puVar14->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        std::vector<wasm::Function*,std::allocator<wasm::Function*>>::emplace_back<wasm::Function*>
                  ((vector<wasm::Function*,std::allocator<wasm::Function*>> *)&ppFStack_48,
                   (Function **)auStack_68);
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar1);
  }
  ppFVar7 = moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  puVar2 = (this->wasm->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (Builder *)
             (this->wasm->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar16 = ppFStack_48; ppFVar16 != ppFVar7; ppFVar16 = ppFVar16 + 1) {
    addInvocations(this,*ppFVar16);
  }
  this_00 = &this->random;
  local_74 = Random::upTo(this_00,0xb);
  if ((this->random).finishedInput == false) {
    do {
      if (ppFStack_48 ==
          moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
LAB_00140423:
        auStack_68 = (undefined1  [8])addFunction(this);
        addInvocations(this,(Function *)auStack_68);
        if (this->allowOOB == true) {
          if (moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<wasm::Function*,std::allocator<wasm::Function*>>::
            _M_realloc_insert<wasm::Function*const&>
                      ((vector<wasm::Function*,std::allocator<wasm::Function*>> *)&ppFStack_48,
                       (iterator)
                       moddable.
                       super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,(Function **)auStack_68);
          }
          else {
            *moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
             _M_impl.super__Vector_impl_data._M_start = (Function *)auStack_68;
            moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl
            .super__Vector_impl_data._M_start =
                 moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
      }
      else {
        uVar8 = Random::upTo(this_00,10);
        if (local_74 <= uVar8) goto LAB_00140423;
        uVar8 = Random::upTo(this_00,(uint32_t)
                                     ((ulong)((long)moddable.
                                                  super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                             (long)ppFStack_48) >> 3));
        modFunction(this,ppFStack_48[uVar8]);
        ppFStack_48[uVar8] =
             moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
             _M_impl.super__Vector_impl_data._M_start[-1];
        moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
             _M_impl.super__Vector_impl_data._M_start + -1;
      }
    } while ((this->random).finishedInput != true);
  }
  auStack_68 = (undefined1  [8])0x0;
  noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar14 = (this->wasm->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar14 != puVar1) {
    do {
      lVar9 = ::wasm::HeapType::getSignature();
      if (lVar9 == 0) {
        ::wasm::HeapType::getSignature();
        if (extraout_RDX == 0) {
          _Var3._M_head_impl =
               (puVar14->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          if (noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                      ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_68,
                       (iterator)
                       noParamsOrResultFuncs.
                       super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                       super__Vector_impl_data._M_start,(Name *)_Var3._M_head_impl);
          }
          else {
            pcVar6 = *(char **)((long)&(_Var3._M_head_impl)->super_Importable + 8);
            ((noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
              _M_impl.super__Vector_impl_data._M_start)->super_IString).str._M_len =
                 *(size_t *)&(_Var3._M_head_impl)->super_Importable;
            ((noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
              _M_impl.super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar6;
            noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar1);
  }
  local_80 = this_00;
  if ((pointer)local_70 != puVar2 &&
      auStack_68 !=
      (undefined1  [8])
      noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar9 = (long)local_70 - (long)puVar2;
    local_70 = &this->builder;
    uVar15 = 0;
    uVar17 = 1;
    do {
      puVar2 = (this->wasm->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)puVar2[uVar15]._M_t + 0x10) == 0) {
        uVar8 = Random::upTo(local_80,10);
        if (uVar8 < local_74) {
          uVar4._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
          super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl = puVar2[uVar15]._M_t;
          if (*(char *)((long)uVar4._M_t.
                              super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                              .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x28) ==
              '\0') {
            puVar10 = (undefined8 *)
                      ((long)uVar4._M_t.
                             super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                             .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x18);
          }
          else {
            puVar10 = (undefined8 *)0x0;
          }
          NVar18.super_IString.str._M_str = (char *)*puVar10;
          NVar18.super_IString.str._M_len = (size_t)this->wasm;
          lVar11 = ::wasm::Module::getFunction(NVar18);
          if (*(long *)(lVar11 + 0x20) == 0) {
            pvVar12 = Random::pick<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                                (local_80,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                                          auStack_68);
            local_98.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_98.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_98.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            args = &local_98;
            left = Builder::makeCall(local_70,(Name)(pvVar12->super_IString).str,args,(Type)0x0,
                                     false);
            if (local_98.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_98.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_98.
                                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_98.
                                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 0;
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)args;
            pBVar13 = Builder::makeSequence
                                (local_70,(Expression *)left,*(Expression **)(lVar11 + 0x60),type);
            *(Block **)(lVar11 + 0x60) = pBVar13;
          }
        }
      }
      bVar5 = uVar17 < (ulong)(lVar9 >> 3);
      uVar15 = uVar17;
      uVar17 = (ulong)((int)uVar17 + 1);
    } while (bVar5);
  }
  if (0 < (this->fuzzParams->super_FuzzParams).HANG_LIMIT) {
    puVar1 = (this->wasm->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar14 = (this->wasm->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar1;
        puVar14 = puVar14 + 1) {
      _Var3._M_head_impl =
           (puVar14->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(_Var3._M_head_impl)->super_Importable + 0x20) == (char *)0x0) {
        addHangLimitChecks(this,_Var3._M_head_impl);
      }
    }
  }
  if (auStack_68 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_68,
                    (long)noParamsOrResultFuncs.
                          super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_68);
  }
  if (ppFStack_48 != (pointer)0x0) {
    operator_delete(ppFStack_48,
                    (long)moddable.
                          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppFStack_48);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::processFunctions() {
  // Functions that are eligible for being modded. We only do so once to each
  // function, at most, so once we do we remove it from here.
  std::vector<Function*> moddable;

  // Defined initial functions are moddable.
  for (auto& func : wasm.functions) {
    if (!func->imported()) {
      moddable.push_back(func.get());
    }
  }

  auto numInitialExports = wasm.exports.size();

  // Add invocations, which can help execute the code here even if the function
  // was not exported (or was exported but with a signature that traps
  // immediately, like receiving a non-nullable ref, that the fuzzer can't
  // provide from JS). Note we cannot iterate on wasm.functions because
  // addInvocations modifies that.
  for (auto* func : moddable) {
    addInvocations(func);
  }

  // We do not want to always mod in the same frequency. Pick a chance to mod a
  // function. When the chance is maximal we will mod every single function, and
  // immediately after creating it; when the chance is minimal we will not mod
  // anything; values in the middle will end up randomly modding some functions,
  // at random times (random times are useful because we might create function
  // A, then B, then mod A, and since B has already been created, the modding of
  // A may lead to calls to B).
  const int RESOLUTION = 10;
  auto chance = upTo(RESOLUTION + 1);

  // Keep working while we have random data.
  while (!random.finished()) {
    if (!moddable.empty() && upTo(RESOLUTION) < chance) {
      // Mod an existing function.
      auto index = upTo(moddable.size());
      auto* func = moddable[index];
      modFunction(func);

      // Remove this function from the vector by swapping the last item to its
      // place, and truncating.
      moddable[index] = moddable.back();
      moddable.pop_back();
    } else {
      // Add a new function
      auto* func = addFunction();
      addInvocations(func);

      // It may be modded later, if we allow out-of-bounds: we emit OOB checks
      // in the code we just generated, and any changes could break that.
      if (allowOOB) {
        moddable.push_back(func);
      }
    }
  }

  // Interpose on initial exports. When initial content contains exports, it can
  // be useful to add new code that executes in them, rather than just adding
  // new exports later. To some extent modifying the initially-exported function
  // gives us that, but typically these are small changes, not calls to entirely
  // new code (and this is especially important when preserveImportsAndExports,
  // as in that mode we do not add new exports, so this interposing is our main
  // chance to run new code using the existing exports).
  //
  // Interpose with a call before the old code. We do a call here so that we end
  // up running a useful amount of new code (rather than just make(none) which
  // would only emit something local in the current function, and which depends
  // on its contents).
  // TODO: We could also interpose after, either in functions without results,
  //       or by saving the results to a temp local as we call.
  //
  // Specifically, we will call functions, for simplicity, with no params or
  // results. Such functions exist in abundance in general, because the
  // invocations we add look exactly that way. First, find all such functions,
  // and then find places to interpose calls to them.
  std::vector<Name> noParamsOrResultFuncs;
  for (auto& func : wasm.functions) {
    if (func->getParams() == Type::none && func->getResults() == Type::none) {
      noParamsOrResultFuncs.push_back(func->name);
    }
  }
  if (!noParamsOrResultFuncs.empty()) {
    for (Index i = 0; i < numInitialExports; i++) {
      auto& exp = wasm.exports[i];
      if (exp->kind == ExternalKind::Function && upTo(RESOLUTION) < chance) {
        auto* func = wasm.getFunction(*exp->getInternalName());
        if (!func->imported()) {
          auto* call =
            builder.makeCall(pick(noParamsOrResultFuncs), {}, Type::none);
          func->body = builder.makeSequence(call, func->body);
        }
      }
    }
  }

  // At the very end, add hang limit checks (so no modding can override them).
  if (fuzzParams->HANG_LIMIT > 0) {
    for (auto& func : wasm.functions) {
      if (!func->imported()) {
        addHangLimitChecks(func.get());
      }
    }
  }
}